

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

uint prvTidytmbstrcat(tmbstr s1,ctmbstr s2)

{
  char cVar1;
  uint local_1c;
  ctmbstr ptStack_18;
  uint ncpy;
  ctmbstr s2_local;
  tmbstr s1_local;
  
  local_1c = 0;
  for (s2_local = s1; ptStack_18 = s2, *s2_local != '\0'; s2_local = s2_local + 1) {
  }
  while( true ) {
    cVar1 = *ptStack_18;
    *s2_local = cVar1;
    if (cVar1 == '\0') break;
    local_1c = local_1c + 1;
    ptStack_18 = ptStack_18 + 1;
    s2_local = s2_local + 1;
  }
  return local_1c;
}

Assistant:

uint TY_(tmbstrcat)( tmbstr s1, ctmbstr s2 )
{
    uint ncpy = 0;
    while ( *s1 )
        ++s1;

    while (0 != (*s1++ = *s2++) )
        ++ncpy;
    return ncpy;
}